

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

void stack_destroy_callback(stack *stack,stack_data_free_function free_function)

{
  stack_item *__ptr;
  
  if (free_function != (stack_data_free_function)0x0) {
    while (__ptr = stack->head, __ptr != (stack_item *)0x0) {
      stack->head = __ptr->next;
      stack->length = stack->length - 1;
      (*free_function)(__ptr->data);
      free(__ptr);
    }
    free(stack);
    return;
  }
  stack_destroy(stack);
  return;
}

Assistant:

void stack_destroy_callback(struct stack *stack, stack_data_free_function free_function)
{
        if (free_function == NULL) {
                stack_destroy(stack);

                return;
        }

        struct stack_item *curr = NULL;

        while ((curr = stack_pop(stack)) != NULL) {
                free_function((void *)curr->data);

                stack_item_destroy(curr);
        }

        free(stack);
}